

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream_range.hpp
# Opt level: O0

iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *
burst::make_istream_range<int>
          (iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>
           *__return_storage_ptr__,istream *s)

{
  istream_iterator<int,_char,_std::char_traits<char>,_long> *in_RCX;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_38;
  istream_iterator<int,_char,_std::char_traits<char>,_long> local_28;
  istream *local_18;
  istream *s_local;
  
  local_18 = s;
  s_local = (istream *)__return_storage_ptr__;
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::istream_iterator(&local_28,s);
  std::istream_iterator<int,_char,_std::char_traits<char>,_long>::istream_iterator(&local_38);
  boost::make_iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>
            (__return_storage_ptr__,(boost *)&local_28,&local_38,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

auto make_istream_range (std::istream & s)
    {
        return boost::make_iterator_range(std::istream_iterator<T>(s), std::istream_iterator<T>{});
    }